

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting.hpp
# Opt level: O0

double ising::counting::free_energy<lattice::graph>(double beta,graph *lat,double J,double H)

{
  vector<double,_std::allocator<double>_> *this;
  double dVar1;
  double in_XMM2_Qa;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  graph *in_stack_00000038;
  vector<double,_std::allocator<double>_> field;
  vector<double,_std::allocator<double>_> inter;
  allocator_type *in_stack_ffffffffffffff68;
  allocator_type *__a;
  value_type_conflict2 *in_stack_ffffffffffffff70;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  allocator_type local_69 [73];
  double local_20;
  
  local_20 = in_XMM2_Qa;
  this = (vector<double,_std::allocator<double>_> *)lattice::graph::num_bonds((graph *)0x13bb47);
  std::allocator<double>::allocator((allocator<double> *)0x13bb5b);
  std::vector<double,_std::allocator<double>_>::vector
            (this,(size_type)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  std::allocator<double>::~allocator((allocator<double> *)0x13bb83);
  if ((local_20 != 0.0) || (NAN(local_20))) {
    this_00 = (vector<double,_std::allocator<double>_> *)
              lattice::graph::num_sites((graph *)0x13bba6);
    in_stack_ffffffffffffff78 = this_00;
  }
  else {
    this_00 = (vector<double,_std::allocator<double>_> *)0x0;
  }
  __a = local_69;
  std::allocator<double>::allocator((allocator<double> *)0x13bbdb);
  std::vector<double,_std::allocator<double>_>::vector
            (this,(size_type)in_stack_ffffffffffffff78,(value_type_conflict2 *)this_00,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x13bc03);
  dVar1 = free_energy<lattice::graph>
                    ((double)field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,in_stack_00000038,in_stack_00000030,
                     in_stack_00000028);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return dVar1;
}

Assistant:

static double free_energy(double beta, LATTICE const& lat, double J, double H = 0.0) {
    std::vector<double> inter(lat.num_bonds(), J);
    std::vector<double> field((H != 0.0) ? lat.num_sites() : 0, H);
    return free_energy(beta, lat, inter, field);
  }